

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTportWeight.c
# Opt level: O1

void sbfTport_adjustWeight(sbfTport tport,sbfMwThread thread,int change)

{
  uint uVar1;
  u_int uVar2;
  
  pthread_mutex_lock((pthread_mutex_t *)&tport->mWeightsLock);
  uVar1 = sbfMw_getThreadIndex(thread);
  uVar2 = tport->mWeights[uVar1] + change;
  tport->mWeights[uVar1] = uVar2;
  sbfLog_log(tport->mLog,0,"thread %u weight is %u (%+d)",uVar1,uVar2,change);
  pthread_mutex_unlock((pthread_mutex_t *)&tport->mWeightsLock);
  return;
}

Assistant:

void
sbfTport_adjustWeight (sbfTport tport, sbfMwThread thread, int change)
{
    u_int index;

    sbfMutex_lock (&tport->mWeightsLock);

    index = sbfMw_getThreadIndex (thread);
    tport->mWeights[index] += change;

    sbfLog_debug (tport->mLog,
                  "thread %u weight is %u (%+d)",
                  index,
                  tport->mWeights[index],
                  change);

    sbfMutex_unlock (&tport->mWeightsLock);
}